

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void make_cond_val(c2m_ctx_t c2m_ctx,node_t_conflict r,MIR_label_t true_label,
                  MIR_label_t false_label,op_t *res)

{
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  type *type;
  MIR_type_t t;
  MIR_insn_t_conflict label;
  MIR_insn_t_conflict pMVar2;
  undefined1 local_78 [32];
  anon_union_32_12_57d33f68_for_u aStack_58;
  
  ctx = c2m_ctx->ctx;
  pgVar1 = c2m_ctx->gen_ctx;
  type = *(type **)((long)r->attr + 0x18);
  label = MIR_new_label(ctx);
  t = get_mir_type(c2m_ctx,type);
  get_new_temp((op_t *)local_78,c2m_ctx,t);
  res->decl = (decl_t)local_78._0_8_;
  *(undefined8 *)&res->field_0x8 = local_78._8_8_;
  (res->mir_op).data = (void *)local_78._16_8_;
  *(undefined8 *)&(res->mir_op).field_0x8 = local_78._24_8_;
  (res->mir_op).u.i = aStack_58.i;
  (res->mir_op).u.str.s = aStack_58.str.s;
  *(undefined8 *)((long)&(res->mir_op).u + 0x10) = aStack_58._16_8_;
  (res->mir_op).u.mem.disp = aStack_58.mem.disp;
  emit_label_insn_opt(c2m_ctx,true_label);
  local_78._0_8_ = (pgVar1->one_op).mir_op.data;
  local_78._8_8_ = *(undefined8 *)&(pgVar1->one_op).mir_op.field_0x8;
  local_78._16_8_ = (pgVar1->one_op).mir_op.u.i;
  local_78._24_8_ = (pgVar1->one_op).mir_op.u.str.s;
  aStack_58.i = *(int64_t *)((long)&(pgVar1->one_op).mir_op.u + 0x10);
  aStack_58.str.s = (char *)(pgVar1->one_op).mir_op.u.mem.disp;
  pMVar2 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
  emit_insn_opt(c2m_ctx,pMVar2);
  MIR_new_label_op(ctx,label);
  pMVar2 = MIR_new_insn(c2m_ctx->ctx,MIR_JMP);
  emit_insn_opt(c2m_ctx,pMVar2);
  emit_label_insn_opt(c2m_ctx,false_label);
  local_78._0_8_ = (pgVar1->zero_op).mir_op.data;
  local_78._8_8_ = *(undefined8 *)&(pgVar1->zero_op).mir_op.field_0x8;
  local_78._16_8_ = (pgVar1->zero_op).mir_op.u.i;
  local_78._24_8_ = (pgVar1->zero_op).mir_op.u.str.s;
  aStack_58.i = *(int64_t *)((long)&(pgVar1->zero_op).mir_op.u + 0x10);
  aStack_58.str.s = (char *)(pgVar1->zero_op).mir_op.u.mem.disp;
  pMVar2 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
  emit_insn_opt(c2m_ctx,pMVar2);
  emit_label_insn_opt(c2m_ctx,label);
  return;
}

Assistant:

static void make_cond_val (c2m_ctx_t c2m_ctx, node_t r, MIR_label_t true_label,
                           MIR_label_t false_label, op_t *res) {
  MIR_context_t ctx = c2m_ctx->ctx;
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = ((struct expr *) r->attr)->type;
  MIR_label_t end_label = MIR_new_label (ctx);
  *res = get_new_temp (c2m_ctx, get_mir_type (c2m_ctx, type));
  emit_label_insn_opt (c2m_ctx, true_label);
  emit2 (c2m_ctx, MIR_MOV, res->mir_op, one_op.mir_op);
  emit1 (c2m_ctx, MIR_JMP, MIR_new_label_op (ctx, end_label));
  emit_label_insn_opt (c2m_ctx, false_label);
  emit2 (c2m_ctx, MIR_MOV, res->mir_op, zero_op.mir_op);
  emit_label_insn_opt (c2m_ctx, end_label);
}